

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

bool __thiscall
flatbuffers::go::GoGenerator::NamespacePtrLess::operator()
          (NamespacePtrLess *this,Definition *a,Definition *b)

{
  Namespace *pNVar1;
  Namespace *pNVar2;
  pointer pbVar3;
  uint uVar4;
  ulong uVar5;
  size_type __n;
  pointer pbVar6;
  pointer pbVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  bool bVar11;
  
  pNVar1 = a->defined_namespace;
  pNVar2 = b->defined_namespace;
  pbVar6 = (pNVar1->components).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(pNVar1->components).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5;
  pbVar7 = (pNVar2->components).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(pNVar2->components).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5;
  if (uVar5 <= uVar8) {
    uVar8 = uVar5;
  }
  bVar11 = uVar8 != 0;
  if (bVar11) {
    __n = pbVar6->_M_string_length;
    if (__n == pbVar7->_M_string_length) {
      uVar9 = 1;
      do {
        if (__n != 0) {
          uVar4 = bcmp((pbVar6->_M_dataplus)._M_p,(pbVar7->_M_dataplus)._M_p,__n);
          uVar5 = (ulong)uVar4;
          if (uVar4 != 0) break;
        }
        bVar11 = uVar9 < uVar8;
        if (uVar9 == uVar8) goto LAB_002055c2;
        __n = pbVar6[1]._M_string_length;
        pbVar6 = pbVar6 + 1;
        uVar9 = uVar9 + 1;
        pbVar3 = pbVar7 + 1;
        pbVar7 = pbVar7 + 1;
      } while (__n == pbVar3->_M_string_length);
    }
    uVar4 = std::__cxx11::string::compare((string *)pbVar6);
    uVar5 = (ulong)(uVar4 >> 0x1f);
  }
LAB_002055c2:
  bVar10 = (byte)uVar5;
  if (!bVar11) {
    bVar10 = (ulong)((long)(pNVar1->components).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pNVar1->components).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) <
             (ulong)((long)(pNVar2->components).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pNVar2->components).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(bVar10 & 1);
}

Assistant:

bool operator()(const Definition *a, const Definition *b) const {
      return *a->defined_namespace < *b->defined_namespace;
    }